

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geom.cpp
# Opt level: O1

Vector3d * ear::toCartesianVector3d(Vector3d *__return_storage_ptr__,SpeakerPosition *position)

{
  SpeakerPosition SVar1;
  uint uVar2;
  long lVar3;
  SpeakerPosition *pSVar4;
  double *pdVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double local_e0 [5];
  double local_b8;
  double local_90;
  char local_68;
  long *local_60 [2];
  long local_50 [2];
  char local_40;
  long *local_38 [2];
  long local_28 [2];
  
  uVar2 = (int)*(uint *)position >> 0x1f ^ *(uint *)position;
  if (0x13 < uVar2) {
switchD_0013308b_caseD_2:
    boost::detail::variant::forced_return<Eigen::Matrix<double,3,1,0,3,1>>();
  }
  switch(uVar2) {
  case 0:
    pSVar4 = position + 8;
    pdVar5 = local_e0;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar5 = *(double *)pSVar4;
      pSVar4 = pSVar4 + 8;
      pdVar5 = pdVar5 + 1;
    }
    local_68 = 0;
    bVar6 = position[0x80] == (SpeakerPosition)0x1;
    if (bVar6) {
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,*(long *)(position + 0x88),
                 *(long *)(position + 0x90) + *(long *)(position + 0x88));
    }
    local_40 = 0;
    SVar1 = position[0xa8];
    local_68 = bVar6;
    if (SVar1 == (SpeakerPosition)0x1) {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_38,*(long *)(position + 0xb0),
                 *(long *)(position + 0xb8) + *(long *)(position + 0xb0));
    }
    local_40 = SVar1 == (SpeakerPosition)0x1;
    dVar7 = sin(local_e0[0] * -0.017453292519943295);
    dVar8 = local_b8 * 0.017453292519943295;
    dVar9 = cos(dVar8);
    dVar7 = dVar9 * dVar7 * local_90;
    dVar9 = cos(local_e0[0] * -0.017453292519943295);
    dVar10 = cos(dVar8);
    dVar9 = dVar10 * dVar9 * local_90;
    dVar8 = sin(dVar8);
    local_90 = dVar8 * local_90;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = dVar7;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dVar9;
    break;
  case 1:
    pSVar4 = position + 8;
    pdVar5 = local_e0;
    for (lVar3 = 0xf; lVar3 != 0; lVar3 = lVar3 + -1) {
      *pdVar5 = *(double *)pSVar4;
      pSVar4 = pSVar4 + 8;
      pdVar5 = pdVar5 + 1;
    }
    local_68 = 0;
    bVar6 = position[0x80] == (SpeakerPosition)0x1;
    if (bVar6) {
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_60,*(long *)(position + 0x88),
                 *(long *)(position + 0x90) + *(long *)(position + 0x88));
    }
    local_40 = 0;
    SVar1 = position[0xa8];
    local_68 = bVar6;
    if (SVar1 == (SpeakerPosition)0x1) {
      local_38[0] = local_28;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_38,*(long *)(position + 0xb0),
                 *(long *)(position + 0xb8) + *(long *)(position + 0xb0));
    }
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] = local_e0[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = local_b8;
    local_40 = SVar1 == (SpeakerPosition)0x1;
    break;
  default:
    goto switchD_0013308b_caseD_2;
  }
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = local_90;
  if (local_40 == '\x01') {
    if (local_38[0] != local_28) {
      operator_delete(local_38[0],local_28[0] + 1);
    }
    local_40 = '\0';
  }
  if ((local_68 == '\x01') && (local_60[0] != local_50)) {
    operator_delete(local_60[0],local_50[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3d toCartesianVector3d(SpeakerPosition position) {
    return boost::apply_visitor(
        [](const auto& p) { return toCartesianVector3d(p); }, position);
  }